

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O1

int __thiscall BCL::int_compare_and_swap(BCL *this,GlobalPtr<int> ptr,int old_val,int new_val)

{
  int iVar1;
  debug_error *pdVar2;
  int result;
  int local_64;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  undefined4 local_1c;
  
  local_1c = (undefined4)ptr.ptr;
  local_20 = old_val;
  iVar1 = MPI_Compare_and_swap
                    (&local_20,&local_1c,&local_64,&ompi_mpi_int,(ulong)this & 0xffffffff,ptr.rank,
                     win);
  if (iVar1 != 0) {
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_60,iVar1);
    std::operator+(&local_40,"BCL int_compare_and_swap(): MPI_Compare_and_swap return error code ",
                   &local_60);
    debug_error::debug_error(pdVar2,&local_40);
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  iVar1 = MPI_Win_flush_local((ulong)this & 0xffffffff,win);
  if (iVar1 == 0) {
    return local_64;
  }
  pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
  std::__cxx11::to_string(&local_60,iVar1);
  std::operator+(&local_40,"BCL int_compare_and_swap(): MPI_Win_flush_local return error code ",
                 &local_60);
  debug_error::debug_error(pdVar2,&local_40);
  __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

inline int int_compare_and_swap(const GlobalPtr <int> ptr, const int old_val,
  const int new_val) {
  int result;

  int error_code = MPI_Compare_and_swap(&new_val, &old_val, &result, MPI_INT, ptr.rank, ptr.ptr, BCL::win);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL int_compare_and_swap(): MPI_Compare_and_swap return error code " + std::to_string(error_code));
          }
  )

  error_code = MPI_Win_flush_local(ptr.rank, BCL::win);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL int_compare_and_swap(): MPI_Win_flush_local return error code " + std::to_string(error_code));
          }
  )
  return result;
}